

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::SetUse(LinearScan *this,Instr *instr,RegOpnd *regOpnd)

{
  uint uVar1;
  StackSym *this_00;
  Lifetime *lifetime;
  RegNum RVar2;
  bool bVar3;
  uint32 uVar4;
  Instr *instr_00;
  LinearScan *this_01;
  
  if (regOpnd->m_reg != RegNOREG) {
    RecordLoopUse(this,(Lifetime *)0x0,regOpnd->m_reg);
    return;
  }
  this_00 = regOpnd->m_sym;
  lifetime = *(Lifetime **)&(this_00->scratch).globOpt;
  PrepareForUse(this,lifetime);
  if (((lifetime->field_0x9c & 1) != 0) &&
     (RVar2 = GetAssignedTempReg(this,lifetime,(regOpnd->super_Opnd).m_type), RVar2 == RegNOREG)) {
    bVar3 = StackSym::IsConst(this_00);
    if ((bVar3) && (bVar3 = EncoderMD::TryConstFold(instr,regOpnd), bVar3)) {
      return;
    }
    RVar2 = SecondChanceAllocation(this,lifetime,false);
    if (RVar2 == RegNOREG) {
      bVar3 = StackSym::IsConst(this_00);
      if (((!bVar3) && (bVar3 = RegsAvailable(this,(regOpnd->super_Opnd).m_type), !bVar3)) &&
         (bVar3 = EncoderMD::TryFold(instr,regOpnd), bVar3)) {
        return;
      }
      RVar2 = SecondChanceAllocation(this,lifetime,true);
      instr_00 = instr;
      if (RVar2 == RegNOREG) {
        RVar2 = FindReg(this,(Lifetime *)0x0,regOpnd,false);
        AssignTempReg(this,lifetime,RVar2);
      }
    }
    else {
      instr_00 = TryHoistLoad(this,instr,lifetime);
    }
    InsertLoad(this,instr_00,this_00,RVar2);
  }
  if (((lifetime->field_0x9c & 1) == 0) &&
     (uVar4 = IR::Instr::GetNumber(instr), uVar4 < lifetime->end)) {
    RecordUse(this,lifetime,instr,regOpnd,false);
  }
  else {
    uVar4 = 0;
    if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
      uVar1 = this->loopNest;
      if (uVar1 < 6) {
        uVar4 = 1 << ((char)uVar1 * '\x03' & 0x1fU);
      }
      else {
        uVar4 = uVar1 * 0x8000 - 0x28000;
      }
    }
    Lifetime::SubFromUseCount(lifetime,uVar4,this->curLoop);
  }
  this_01 = (LinearScan *)&this->instrUseRegs;
  BVUnitT<unsigned_long>::Set((BVUnitT<unsigned_long> *)this_01,(uint)lifetime->reg);
  SetReg(this_01,regOpnd);
  return;
}

Assistant:

void
LinearScan::SetUse(IR::Instr *instr, IR::RegOpnd *regOpnd)
{
    if (regOpnd->GetReg() != RegNOREG)
    {
        this->RecordLoopUse(nullptr, regOpnd->GetReg());
        return;
    }

    StackSym *sym = regOpnd->m_sym;
    Lifetime * lifetime = sym->scratch.linearScan.lifetime;

    this->PrepareForUse(lifetime);

    if (lifetime->isSpilled)
    {
        // See if it has been loaded in this basic block
        RegNum reg = this->GetAssignedTempReg(lifetime, regOpnd->GetType());
        if (reg == RegNOREG)
        {
            if (sym->IsConst() && EncoderMD::TryConstFold(instr, regOpnd))
            {
                return;
            }

            reg = this->SecondChanceAllocation(lifetime, false);
            if (reg != RegNOREG)
            {
                IR::Instr *insertInstr = this->TryHoistLoad(instr, lifetime);
                this->InsertLoad(insertInstr, sym, reg);
            }
            else
            {
                // Try folding if there are no registers available
                if (!sym->IsConst() && !this->RegsAvailable(regOpnd->GetType()) && EncoderMD::TryFold(instr, regOpnd))
                {
                    return;
                }

                // We need a reg no matter what.  Try to force second chance to re-allocate this.
                reg = this->SecondChanceAllocation(lifetime, true);

                if (reg == RegNOREG)
                {
                    // Forcing second chance didn't work.
                    // Allocate a new temp reg for it
                    reg = this->FindReg(nullptr, regOpnd);
                    this->AssignTempReg(lifetime, reg);
                }

                this->InsertLoad(instr, sym, reg);
            }
        }
    }
    if (!lifetime->isSpilled && instr->GetNumber() < lifetime->end)
    {
        // Don't border to record the use if this is the last use of the lifetime.
        this->RecordUse(lifetime, instr, regOpnd);
    }
    else
    {
        lifetime->SubFromUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr)), this->curLoop);
    }
    this->instrUseRegs.Set(lifetime->reg);

    this->SetReg(regOpnd);
}